

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O1

spv_result_t spvtools::val::ValidateDecorations(ValidationState_t *vstate)

{
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *p_Var1;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  MatrixLayout id;
  MatrixLayout id_00;
  float fVar5;
  uint uVar6;
  _Head_base<0UL,_spv::Decoration,_false> id_01;
  _Head_base<1UL,_unsigned_int,_false> _Var7;
  _Rb_tree_color _Var8;
  pointer pEVar9;
  __node_base_ptr p_Var10;
  pointer puVar11;
  _Hash_node_base *p_Var12;
  pointer pIVar13;
  pointer pFVar14;
  __node_base _Var15;
  size_type sVar16;
  __hashtable *p_Var17;
  __hashtable *p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  StorageClass SVar22;
  undefined4 uVar23;
  MatrixLayout MVar24;
  int iVar25;
  uint uVar26;
  uint32_t uVar27;
  MatrixLayout MVar28;
  spv_result_t sVar29;
  uint32_t uVar30;
  Op OVar31;
  MemoryModel MVar32;
  ValidationState_t *pVVar33;
  mapped_type *pmVar34;
  MatrixLayout *pMVar35;
  mapped_type *pmVar36;
  Instruction *pIVar37;
  __hashtable *p_Var38;
  _Rb_tree_node_base *p_Var39;
  MatrixLayout *pMVar40;
  Instruction *pIVar41;
  DiagnosticStream *pDVar42;
  iterator iVar43;
  iterator iVar44;
  vector<spvtools::val::Function,_std::allocator<spvtools::val::Function>_> *pvVar45;
  size_t sVar46;
  __node_base *p_Var47;
  ostream *poVar48;
  _Base_ptr p_Var49;
  _Tuple_impl<1UL,_unsigned_int> _Var50;
  uint uVar51;
  ValidationState_t *in_RCX;
  _Tuple_impl<0UL,_spv::Decoration,_unsigned_int> vstate_00;
  _Base_ptr p_Var52;
  _Base_ptr p_Var53;
  ValidationState_t *vstate_01;
  Decoration decoration;
  int iVar54;
  long lVar55;
  ValidationState_t *pVVar56;
  char *decoration_str;
  Function *function;
  __node_base_ptr p_Var57;
  __hashtable *p_Var58;
  anon_unknown_0 *this;
  pointer this_00;
  byte bVar59;
  _Rb_tree_header *p_Var60;
  char *pcVar61;
  ulong uVar62;
  pointer pIVar63;
  uint32_t pair_idx;
  pointer pEVar64;
  uint32_t decoration_00;
  MatrixLayout *pMVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  char cVar69;
  pair<std::__detail::_Node_iterator<spvtools::val::Instruction_*,_true,_false>,_bool> pVar70;
  pair<std::__detail::_Node_iterator<spv::BuiltIn,_true,_false>,_bool> pVar71;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar72;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int>_>,_bool> pVar73;
  pair<std::_Rb_tree_iterator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_bool>
  pVar74;
  MatrixLayout *local_628;
  spv_result_t local_61c;
  string linkage_name;
  __node_base *local_5f0;
  uint local_5bc;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  output_var_builtin;
  __hashtable *__h_2;
  int local_574;
  _Base_ptr local_570;
  PerIDKey k;
  undefined8 uStack_560;
  undefined1 local_558 [24];
  __hashtable *__h;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_538;
  uint ep_id;
  undefined4 uStack_52c;
  Instruction *var_instr;
  uint32_t uStack_520;
  undefined4 uStack_51c;
  code *local_518;
  code *local_510;
  ValidationState_t *local_508;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_500;
  _Base_ptr local_4f8;
  int local_4ec;
  EnumSet<spv::Capability> *local_4e8;
  __hashtable *__h_1;
  pointer local_4d8;
  unordered_set<spv::BuiltIn,_std::hash<spv::BuiltIn>,_std::equal_to<spv::BuiltIn>,_std::allocator<spv::BuiltIn>_>
  input_var_builtin;
  __hashtable *__h_3;
  BuiltIn builtin;
  undefined4 uStack_484;
  undefined8 uStack_480;
  code *local_478;
  code *local_470;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_468;
  MatrixLayout *local_460;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_458;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_438;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_418;
  undefined1 local_3f8 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_3f0;
  undefined4 local_3d8;
  spv_result_t local_228;
  float local_220;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_218;
  undefined4 local_200;
  float local_1f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f0;
  undefined4 local_1d8;
  float local_1d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1c8;
  undefined4 local_1b0;
  unordered_set<spvtools::val::Instruction_*,_std::hash<spvtools::val::Instruction_*>,_std::equal_to<spvtools::val::Instruction_*>,_std::allocator<spvtools::val::Instruction_*>_>
  seen_vars;
  ios_base local_138 [264];
  
  local_5f0 = &(vstate->global_vars_)._M_h._M_before_begin;
  do {
    local_5f0 = local_5f0->_M_nxt;
    if (local_5f0 == (__node_base *)0x0) {
      local_61c = SPV_SUCCESS;
      break;
    }
    sVar16 = *(size_type *)(local_5f0 + 1);
    pVVar33 = (ValidationState_t *)ValidationState_t::FindDef(vstate,(uint32_t)sVar16);
    bVar68 = true;
    if (((long)pVVar33->options_ -
         (long)(((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&pVVar33->context_)->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start == 0x14) &&
       (bVar19 = anon_unknown_0::hasImportLinkageAttribute((uint32_t)sVar16,vstate), bVar19)) {
      ValidationState_t::diag
                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,(Instruction *)pVVar33);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3f8,
                 "A module-scope OpVariable with initialization value cannot be marked with the Import Linkage Type."
                 ,0x62);
      local_61c = local_228;
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
      bVar68 = false;
      in_RCX = pVVar33;
    }
  } while (bVar68);
  if (local_61c == SPV_SUCCESS) {
    pMVar40 = (vstate->entry_points_).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_460 = (vstate->entry_points_).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    decoration = (Decoration)vstate;
    if (pMVar40 != local_460) {
      local_468 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&vstate->entry_point_descriptions_;
      local_538 = &vstate->id_decorations_;
      __h_1 = (__hashtable *)&vstate->grammar_;
      local_4e8 = &vstate->module_capabilities_;
      do {
        MVar28 = *pMVar40;
        local_3f8._0_4_ = MVar28;
        pmVar34 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::at(local_468,(key_type *)local_3f8);
        pEVar64 = (pmVar34->
                  super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pEVar9 = (pmVar34->
                 super__Vector_base<spvtools::val::ValidationState_t::EntryPointDescription,_std::allocator<spvtools::val::ValidationState_t::EntryPointDescription>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        iVar25 = 4;
        if (pEVar64 != pEVar9) {
          local_5bc = 0;
          local_500 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                       *)((ulong)local_500 & 0xffffffff00000000);
          local_574 = 0;
          local_4ec = 0;
          uVar23 = 0;
          do {
            local_508 = (ValidationState_t *)CONCAT44(local_508._4_4_,uVar23);
            seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
            seen_vars._M_h._M_bucket_count = 1;
            seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            seen_vars._M_h._M_element_count = 0;
            seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
            seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
            input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
            input_var_builtin._M_h._M_bucket_count = 1;
            input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            input_var_builtin._M_h._M_element_count = 0;
            input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
            input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
            output_var_builtin._M_h._M_buckets = &output_var_builtin._M_h._M_single_bucket;
            output_var_builtin._M_h._M_bucket_count = 1;
            output_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            output_var_builtin._M_h._M_element_count = 0;
            output_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            output_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
            output_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
            local_628 = (pEVar64->interfaces).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            local_4d8 = (pointer)pEVar64;
            for (pMVar65 = (pEVar64->interfaces).
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_start; pMVar65 != local_628;
                pMVar65 = pMVar65 + 1) {
              id = *pMVar65;
              var_instr = ValidationState_t::FindDef(vstate,id);
              if (var_instr == (Instruction *)0x0) {
LAB_002d31d2:
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,
                           "Interfaces passed to OpEntryPoint must be variables. Found Op",0x3d);
                linkage_name._M_dataplus._M_p = spvOpcodeString((uint)(var_instr->inst_).opcode);
                pDVar42 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_3f8,(char **)&linkage_name);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar42,".",1);
                local_5f0 = (__node_base *)(ulong)(uint)pDVar42->error_;
LAB_002d32c2:
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
LAB_002d32ca:
                iVar25 = 1;
              }
              else {
                uVar2 = (var_instr->inst_).opcode;
                vstate_00._2_6_ = 0;
                vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                super__Head_base<1UL,_unsigned_int,_false>._M_head_impl._0_2_ = uVar2;
                if ((uVar2 != 0x3b) && (uVar2 != 0x1142)) goto LAB_002d31d2;
                SVar22 = Instruction::GetOperandAs<spv::StorageClass>(var_instr,2);
                if (0x103ff < vstate->version_) {
                  if (SVar22 == Function) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                    lVar55 = 0x39;
                    pcVar61 = "OpEntryPoint interfaces should only list global variables";
                    goto LAB_002d32b5;
                  }
                  local_3f8 = (undefined1  [8])&seen_vars;
                  pVar70 = std::
                           _Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           ::
                           _M_insert<spvtools::val::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::val::Instruction*,false>>>>
                                     ((_Hashtable<spvtools::val::Instruction*,spvtools::val::Instruction*,std::allocator<spvtools::val::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::val::Instruction*>,std::hash<spvtools::val::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                       *)local_3f8,&var_instr,(DiagnosticStream *)local_3f8);
                  if (((undefined1  [16])pVar70 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                  goto LAB_002d3312;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"Non-unique OpEntryPoint interface ",0x22);
                  ValidationState_t::getIdName_abi_cxx11_(&linkage_name,vstate,id);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  lVar55 = 0xe;
                  pcVar61 = " is disallowed";
LAB_002d38af:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar61,lVar55);
                  local_5f0 = (__node_base *)(ulong)(uint)local_228;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_002d32c2;
                }
                if ((SVar22 & ~Uniform) != Input) {
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,
                             "OpEntryPoint interfaces must be OpVariables with Storage Class of Input(1) or Output(3). Found Storage Class "
                             ,0x6d);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8," for Entry Point id ",0x14);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  lVar55 = 1;
                  pcVar61 = ".";
                  goto LAB_002d32b5;
                }
LAB_002d3312:
                puVar11 = (var_instr->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                if (uVar2 == 0x1142) {
                  pMVar35 = puVar11 + 4;
                }
                else {
                  pIVar37 = ValidationState_t::FindDef(vstate,puVar11[1]);
                  pMVar35 = (pIVar37->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 3;
                }
                id_00 = *pMVar35;
                pIVar37 = ValidationState_t::FindDef(vstate,id_00);
                if (pIVar37 == (Instruction *)0x0) {
                  uVar23 = 0;
                }
                else {
                  uVar23 = (undefined4)
                           CONCAT71((int7)((ulong)pIVar37 >> 8),(pIVar37->inst_).opcode == 0x1e);
                }
                local_5f0 = (__node_base *)((ulong)local_5f0 & 0xffffffff);
                __h = (__hashtable *)CONCAT44(__h._4_4_,uVar23);
                MVar24 = id;
                if ((char)uVar23 != '\0') {
                  MVar24 = id_00;
                }
                local_3f8._0_4_ = MVar24;
                pmVar36 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](local_538,(key_type_conflict *)local_3f8);
                p_Var49 = (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                p_Var60 = &(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
                if ((_Rb_tree_header *)p_Var49 == p_Var60) {
                  iVar25 = 8;
                  bVar68 = false;
                }
                else {
                  bVar68 = false;
                  do {
                    iVar25 = 9;
                    if (p_Var49[1]._M_color == 0xb) {
                      bVar19 = spvIsVulkanEnv(vstate->context_->target_env);
                      bVar68 = true;
                      if (bVar19) {
                        vstate_00.super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                             RelaxedPrecision;
                        vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                        super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                             (_Head_base<1UL,_unsigned_int,_false>)
                             (_Head_base<1UL,_unsigned_int,_false>)SVar22;
                        if (p_Var49[1]._M_color != 0xb) {
                          __assert_fail("dec_type_ == spv::Decoration::BuiltIn",
                                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/decoration.h"
                                        ,0x4f,
                                        "spv::BuiltIn spvtools::val::Decoration::builtin() const");
                        }
                        builtin = (p_Var49[1]._M_parent)->_M_color;
                        iVar25 = 0;
                        if (SVar22 == Output) {
                          local_3f8 = (undefined1  [8])&output_var_builtin;
                          pVar71 = std::
                                   _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   ::
                                   _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                             ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                               *)local_3f8,&builtin,local_3f8);
                          iVar25 = 0;
                          if (((undefined1  [16])pVar71 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) {
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                       var_instr);
                            ValidationState_t::VkErrorID_abi_cxx11_
                                      (&linkage_name,vstate,0x25bb,(char *)0x0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                       linkage_name._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,
                                       "OpEntryPoint contains duplicate output variables with ",0x36
                                      );
                            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                            super__Tuple_impl<1UL,_unsigned_int>.
                            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                 (_Head_base<1UL,_unsigned_int,_false>)0x0;
                            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                            super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                                 RelaxedPrecision;
                            sVar29 = AssemblyGrammar::lookupOperand
                                               ((AssemblyGrammar *)__h_1,SPV_OPERAND_TYPE_BUILT_IN,
                                                builtin,(spv_operand_desc *)&k);
                            vstate_00 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                        ((long)"Value Unknown" + 6);
                            if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                                (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)0x0 &&
                                sVar29 == SPV_SUCCESS) {
                              vstate_00 = *k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>;
                            }
                            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = vstate_00;
                            pDVar42 = DiagnosticStream::operator<<
                                                ((DiagnosticStream *)local_3f8,(char **)&k);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar42," builtin",8);
                            local_5f0 = (__node_base *)(ulong)(uint)pDVar42->error_;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                              operator_delete(linkage_name._M_dataplus._M_p,
                                              linkage_name.field_2._M_allocated_capacity + 1);
                            }
                            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                            iVar25 = 1;
                          }
                        }
                        else if (SVar22 == Input) {
                          local_3f8 = (undefined1  [8])&input_var_builtin;
                          pVar71 = std::
                                   _Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   ::
                                   _M_insert<spv::BuiltIn_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spv::BuiltIn,false>>>>
                                             ((_Hashtable<spv::BuiltIn,spv::BuiltIn,std::allocator<spv::BuiltIn>,std::__detail::_Identity,std::equal_to<spv::BuiltIn>,std::hash<spv::BuiltIn>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                               *)local_3f8,&builtin,(DiagnosticStream *)local_3f8);
                          if (((undefined1  [16])pVar71 & (undefined1  [16])0x1) ==
                              (undefined1  [16])0x0) {
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                       var_instr);
                            ValidationState_t::VkErrorID_abi_cxx11_
                                      (&linkage_name,vstate,0x25ba,(char *)0x0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                       linkage_name._M_string_length);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,
                                       "OpEntryPoint contains duplicate input variables with ",0x35)
                            ;
                            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                            super__Tuple_impl<1UL,_unsigned_int>.
                            super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                                 (_Head_base<1UL,_unsigned_int,_false>)0x0;
                            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                            super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                                 RelaxedPrecision;
                            sVar29 = AssemblyGrammar::lookupOperand
                                               ((AssemblyGrammar *)__h_1,SPV_OPERAND_TYPE_BUILT_IN,
                                                builtin,(spv_operand_desc *)&k);
                            vstate_00 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                        ((long)"Value Unknown" + 6);
                            if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                                (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)0x0 &&
                                sVar29 == SPV_SUCCESS) {
                              vstate_00 = *k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>;
                            }
                            k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = vstate_00;
                            pDVar42 = DiagnosticStream::operator<<
                                                ((DiagnosticStream *)local_3f8,(char **)&k);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)pDVar42," builtin",8);
                            local_5f0 = (__node_base *)(ulong)(uint)pDVar42->error_;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                              operator_delete(linkage_name._M_dataplus._M_p,
                                              linkage_name.field_2._M_allocated_capacity + 1);
                            }
                            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                            iVar25 = 1;
                          }
                          else {
                            iVar25 = 0;
                          }
                        }
                      }
                      else {
                        iVar25 = 9;
                      }
                    }
                    if ((iVar25 != 9) && (iVar25 != 0)) goto LAB_002d36f2;
                    p_Var49 = (_Base_ptr)std::_Rb_tree_increment(p_Var49);
                  } while ((_Rb_tree_header *)p_Var49 != p_Var60);
                  iVar25 = 8;
                }
LAB_002d36f2:
                if (iVar25 != 8) goto LAB_002d32cf;
                if (bVar68) {
                  local_3f8._0_4_ = id;
                  pmVar36 = std::
                            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                            ::operator[](local_538,(key_type_conflict *)local_3f8);
                  p_Var49 = (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  p_Var60 = &(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
                  vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                  super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                       (_Head_base<1UL,_unsigned_int,_false>)0x0;
                  vstate_00.super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                       RelaxedPrecision;
                  pMVar35 = local_628;
                  if ((_Rb_tree_header *)p_Var49 != p_Var60) {
                    do {
                      bVar19 = spvIsVulkanEnv(vstate->context_->target_env);
                      bVar68 = true;
                      if ((bVar19) && ((p_Var49[1]._M_color & ~_S_black) == 0x1e)) {
                        pIVar41 = ValidationState_t::FindDef(vstate,id);
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar41
                                  );
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1333,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,"A BuiltIn variable (id ",0x17);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,
                                   ") cannot have any Location or Component decorations",0x33);
                        pMVar35 = (MatrixLayout *)(ulong)(uint)local_228;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                          operator_delete(linkage_name._M_dataplus._M_p,
                                          linkage_name.field_2._M_allocated_capacity + 1);
                        }
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        bVar68 = false;
                      }
                      if (!bVar68) {
                        vstate_00 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)
                                    ((ulong)pMVar35 & 0xffffffff);
                        goto LAB_002d393e;
                      }
                      p_Var49 = (_Base_ptr)std::_Rb_tree_increment(p_Var49);
                    } while ((_Rb_tree_header *)p_Var49 != p_Var60);
                    vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                         (_Head_base<1UL,_unsigned_int,_false>)0x0;
                    vstate_00.super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                         RelaxedPrecision;
                  }
LAB_002d393e:
                  _Var50 = vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                           super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                  if (_Var50.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl != 0) {
                    local_5f0._0_4_ = _Var50.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl
                    ;
                  }
                  local_5f0 = (__node_base *)(ulong)local_5f0._0_4_;
                  if (_Var50.super__Head_base<1UL,_unsigned_int,_false>._M_head_impl == 0) {
                    if ((char)__h != '\0') {
                      local_3f8._0_4_ = id_00;
                      pmVar36 = std::
                                map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                ::operator[](local_538,(key_type_conflict *)local_3f8);
                      p_Var60 = &(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
                      for (p_Var49 = (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left
                          ; ((_Rb_tree_header *)p_Var49 != p_Var60 && (p_Var49[1]._M_color != 2));
                          p_Var49 = (_Base_ptr)std::_Rb_tree_increment(p_Var49)) {
                      }
                      if ((_Rb_tree_header *)p_Var49 == p_Var60) {
                        pIVar37 = ValidationState_t::FindDef(vstate,id_00);
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_DATA,
                                   pIVar37);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1337,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        lVar55 = 0xc3;
                        pcVar61 = 
                        "Interface struct has no Block decoration but has BuiltIn members. Location decorations must be used on each member of OpVariable with a structure type that is a block not decorated with Location."
                        ;
                        goto LAB_002d38af;
                      }
                      vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                      super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                           (_Head_base<1UL,_unsigned_int,_false>)(local_5bc + (SVar22 == Input));
                      vstate_00.super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                           RelaxedPrecision;
                      iVar54 = (int)local_508 + (uint)(SVar22 == Output);
                      iVar25 = 6;
                      local_508 = (ValidationState_t *)CONCAT44(local_508._4_4_,iVar54);
                      local_5bc = (uint)vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                                        super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                      if ((1 < (int)vstate_00.super__Tuple_impl<1UL,_unsigned_int>.
                                    super__Head_base<1UL,_unsigned_int,_false>._M_head_impl) ||
                         (1 < iVar54)) goto LAB_002d32cf;
                    }
                    goto LAB_002d38ea;
                  }
                  goto LAB_002d32ca;
                }
LAB_002d38ea:
                if (SVar22 == Workgroup) {
                  local_500 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                               *)CONCAT44(local_500._4_4_,(int)local_500 + 1);
                  if (pIVar37 == (Instruction *)0x0) goto LAB_002d3ac9;
                  if ((pIVar37->inst_).opcode == 0x1e) {
                    bVar68 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)id_00,2,decoration,
                                        (ValidationState_t *)vstate_00);
                    if (bVar68) {
                      local_574 = local_574 + 1;
                    }
                    else if ((uVar2 == 0x1142) &&
                            (bVar68 = EnumSet<spv::Capability>::contains(local_4e8,Shader), bVar68))
                    {
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr
                                );
                      lVar55 = 0x3e;
                      pcVar61 = "Untyped workgroup variables in shaders must be block decorated";
                      goto LAB_002d32b5;
                    }
                    bVar68 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,0x14,
                                        decoration,(ValidationState_t *)vstate_00);
                    local_4ec = local_4ec + (uint)bVar68;
                    goto LAB_002d3ac9;
                  }
                  if ((uVar2 != 0x1142) ||
                     (bVar68 = EnumSet<spv::Capability>::contains(local_4e8,Shader), !bVar68))
                  goto LAB_002d3ac9;
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,var_instr);
                  lVar55 = 0x46;
                  pcVar61 = "Untyped workgroup variables in shaders must be block decorated structs"
                  ;
LAB_002d32b5:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar61,lVar55);
                  local_5f0 = (__node_base *)(ulong)(uint)local_228;
                  goto LAB_002d32c2;
                }
LAB_002d3ac9:
                bVar68 = spvIsVulkanEnv(vstate->context_->target_env);
                if (bVar68) {
                  pVVar33 = (ValidationState_t *)
                            ValidationState_t::GetExecutionModels(vstate,MVar28);
                  p_Var60 = (_Rb_tree_header *)&pVVar33->options_;
                  p_Var49 = (_Base_ptr)pVVar33->words_;
                  p_Var52 = (_Base_ptr)p_Var60;
                  for (p_Var53 = p_Var49; p_Var53 != (_Base_ptr)0x0;
                      p_Var53 = (&p_Var53->_M_left)[bVar68]) {
                    bVar68 = p_Var53[1]._M_color < 4;
                    if (!bVar68) {
                      p_Var52 = p_Var53;
                    }
                  }
                  p_Var53 = (_Base_ptr)p_Var60;
                  local_570 = (_Base_ptr)p_Var60;
                  if (((_Rb_tree_header *)p_Var52 != p_Var60) &&
                     (local_570 = p_Var52, 4 < p_Var52[1]._M_color)) {
                    local_570 = (_Base_ptr)p_Var60;
                  }
                  for (; p_Var49 != (_Base_ptr)0x0; p_Var49 = p_Var49->_M_left) {
                    p_Var53 = p_Var49;
                  }
                  local_4f8 = (_Base_ptr)p_Var60;
                  if (((_Rb_tree_header *)p_Var53 != p_Var60) &&
                     (local_4f8 = p_Var53, p_Var53[1]._M_color != _S_red)) {
                    local_4f8 = (_Base_ptr)p_Var60;
                  }
                  local_3f8._0_4_ = (var_instr->inst_).result_id;
                  pmVar36 = std::
                            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                            ::operator[](local_538,(key_type_conflict *)local_3f8);
                  p_Var38 = (__hashtable *)
                            (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  vstate_01 = (ValidationState_t *)&(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
                  iVar25 = 10;
                  bVar68 = (ValidationState_t *)p_Var38 == vstate_01;
                  __h = (__hashtable *)vstate_01;
                  if (!bVar68) {
                    bVar68 = false;
                    do {
                      linkage_name._M_dataplus._M_p = (pointer)0x0;
                      linkage_name._M_string_length = 0;
                      linkage_name.field_2._M_allocated_capacity = 0;
                      local_3f8._0_4_ = 0xe;
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                (&local_3f0,
                                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 &linkage_name);
                      local_3d8 = 0xffffffff;
                      if ((p_Var38->_M_rehash_policy)._M_max_load_factor == (float)local_3f8._0_4_)
                      {
                        p_Var57 = (__node_base_ptr)(p_Var38->_M_rehash_policy)._M_next_resize;
                        pVVar56 = (ValidationState_t *)
                                  ((long)p_Var38->_M_single_bucket - (long)p_Var57);
                        vstate_01 = (ValidationState_t *)
                                    ((long)local_3f0.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_3f0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                        if ((pVVar56 != vstate_01) ||
                           ((p_Var38->_M_single_bucket != p_Var57 &&
                            (iVar25 = bcmp(p_Var57,local_3f0.
                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                           (size_t)pVVar56), iVar25 != 0)))) goto LAB_002d3c54;
                        bVar19 = (int)p_Var38[1]._M_bucket_count == -1;
                      }
                      else {
LAB_002d3c54:
                        bVar19 = false;
                      }
                      if (bVar19) {
LAB_002d3c5c:
                        bVar67 = true;
                        bVar66 = false;
                        bVar20 = false;
                      }
                      else {
                        local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_418.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_1d0 = 1.82169e-44;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                  (&local_1c8,&local_418);
                        local_1b0 = 0xffffffff;
                        if ((p_Var38->_M_rehash_policy)._M_max_load_factor == local_1d0) {
                          p_Var57 = (__node_base_ptr)(p_Var38->_M_rehash_policy)._M_next_resize;
                          pVVar56 = (ValidationState_t *)
                                    ((long)p_Var38->_M_single_bucket - (long)p_Var57);
                          vstate_01 = (ValidationState_t *)
                                      ((long)local_1c8.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1c8.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          if ((pVVar56 == vstate_01) &&
                             (((p_Var38->_M_single_bucket == p_Var57 ||
                               (iVar25 = bcmp(p_Var57,local_1c8.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                              (size_t)pVVar56), iVar25 == 0)) &&
                              ((int)p_Var38[1]._M_bucket_count == -1)))) goto LAB_002d3c5c;
                        }
                        local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_438.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_1f8 = 2.38221e-44;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                  (&local_1f0,&local_438);
                        local_1d8 = 0xffffffff;
                        if ((p_Var38->_M_rehash_policy)._M_max_load_factor == local_1f8) {
                          p_Var57 = (__node_base_ptr)(p_Var38->_M_rehash_policy)._M_next_resize;
                          pVVar56 = (ValidationState_t *)
                                    ((long)p_Var38->_M_single_bucket - (long)p_Var57);
                          vstate_01 = (ValidationState_t *)
                                      ((long)local_1f0.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_1f0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          if (((pVVar56 == vstate_01) &&
                              ((p_Var38->_M_single_bucket == p_Var57 ||
                               (iVar25 = bcmp(p_Var57,local_1f0.
                                                                                                            
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                              (size_t)pVVar56), iVar25 == 0)))) &&
                             ((int)p_Var38[1]._M_bucket_count == -1)) {
                            bVar66 = true;
                            bVar20 = false;
                            bVar67 = true;
                            goto LAB_002d3e11;
                          }
                        }
                        local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_458.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        local_220 = 2.24208e-44;
                        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                                  (&local_218,&local_458);
                        local_200 = 0xffffffff;
                        bVar66 = true;
                        if ((p_Var38->_M_rehash_policy)._M_max_load_factor == local_220) {
                          p_Var57 = (__node_base_ptr)(p_Var38->_M_rehash_policy)._M_next_resize;
                          pVVar56 = (ValidationState_t *)
                                    ((long)p_Var38->_M_single_bucket - (long)p_Var57);
                          vstate_01 = (ValidationState_t *)
                                      ((long)local_218.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_218.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                          if ((pVVar56 != vstate_01) ||
                             ((p_Var38->_M_single_bucket != p_Var57 &&
                              (iVar25 = bcmp(p_Var57,local_218.
                                                                                                          
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                             (size_t)pVVar56), iVar25 != 0)))) goto LAB_002d3e0c;
                          bVar67 = (int)p_Var38[1]._M_bucket_count == -1;
                        }
                        else {
LAB_002d3e0c:
                          bVar67 = false;
                        }
                        bVar20 = true;
                      }
LAB_002d3e11:
                      if (bVar20) {
                        if (local_218.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_218.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_218.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_218.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_458.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_458.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_458.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_458.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      if (bVar66) {
                        if (local_1f0.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_1f0.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_1f0.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_1f0.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_438.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_438.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_438.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_438.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      if (!bVar19) {
                        if (local_1c8.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_1c8.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_1c8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_1c8.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if (local_418.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_418.
                                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_418.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_418.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                      }
                      if (local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_3f0.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                        (long)local_3f0.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_3f0.
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data._M_start);
                      }
                      if (linkage_name._M_dataplus._M_p != (pointer)0x0) {
                        operator_delete(linkage_name._M_dataplus._M_p,
                                        linkage_name.field_2._M_allocated_capacity -
                                        (long)linkage_name._M_dataplus._M_p);
                      }
                      bVar19 = true;
                      if (bVar67) {
                        vstate_01 = (ValidationState_t *)(ulong)SVar22;
                        if (SVar22 == Output) {
                          if (((_Rb_tree_header *)local_570 != p_Var60) ||
                             (vstate_01 = pVVar33, 1 < pVVar33->total_instructions_)) {
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                       var_instr);
                            vstate_01 = (ValidationState_t *)0x0;
                            ValidationState_t::VkErrorID_abi_cxx11_
                                      (&linkage_name,vstate,0x1839,(char *)0x0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                       linkage_name._M_string_length);
                            ValidationState_t::SpvDecorationString_abi_cxx11_
                                      ((string *)&k,vstate,
                                       (uint32_t)(p_Var38->_M_rehash_policy)._M_max_load_factor);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,
                                       (char *)k.
                                               super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                       ,uStack_560);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,
                                       " decorated variable must not be used in fragment execution model as an Output storage class for Entry Point id "
                                       ,0x6f);
                            std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,".",1);
                            sVar29 = local_228;
                            if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                                (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)local_558) {
                              operator_delete((void *)k.
                                                  super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                              ,(ulong)(local_558._0_8_ + 1));
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                              operator_delete(linkage_name._M_dataplus._M_p,
                                              linkage_name.field_2._M_allocated_capacity + 1);
                            }
                            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                            goto LAB_002d41a7;
                          }
                        }
                        else if ((SVar22 == Input) &&
                                (((_Rb_tree_header *)local_4f8 != p_Var60 ||
                                 (1 < pVVar33->total_instructions_)))) {
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     var_instr);
                          vstate_01 = (ValidationState_t *)0x0;
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x183a,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          ValidationState_t::SpvDecorationString_abi_cxx11_
                                    ((string *)&k,vstate,
                                     (uint32_t)(p_Var38->_M_rehash_policy)._M_max_load_factor);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,
                                     (char *)k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                     ,uStack_560);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,
                                     " decorated variable must not be used in vertex execution model as an Input storage class for Entry Point id "
                                     ,0x6c);
                          std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,".",1);
                          sVar29 = local_228;
                          if (k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> !=
                              (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int>)local_558) {
                            operator_delete((void *)k.
                                                  super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>
                                            ,(ulong)(local_558._0_8_ + 1));
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                            operator_delete(linkage_name._M_dataplus._M_p,
                                            linkage_name.field_2._M_allocated_capacity + 1);
                          }
                          DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
LAB_002d41a7:
                          bVar19 = false;
                          local_5f0 = (__node_base *)(ulong)(uint)sVar29;
                        }
                      }
                      if (!bVar19) {
                        iVar25 = 1;
                        goto LAB_002d41f3;
                      }
                      p_Var38 = (__hashtable *)
                                std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var38);
                      bVar68 = p_Var38 == __h;
                    } while (!bVar68);
                    iVar25 = 10;
                  }
LAB_002d41f3:
                  if (bVar68) {
                    bVar68 = anon_unknown_0::hasDecoration
                                       ((anon_unknown_0 *)(ulong)(var_instr->inst_).result_id,0xe,
                                        decoration,vstate_01);
                    if (!bVar68) {
                      iVar25 = 0;
                      if ((SVar22 != Input) || ((_Rb_tree_header *)local_570 == p_Var60))
                      goto LAB_002d32cf;
                      bVar68 = ValidationState_t::IsFloatScalarType(vstate,id_00);
                      if (((bVar68) &&
                          (uVar27 = ValidationState_t::GetBitWidth(vstate,id_00), uVar27 == 0x40))
                         || (bVar68 = ValidationState_t::IsIntScalarOrVectorType(vstate,id_00),
                            bVar68)) {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                   var_instr);
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1288,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,"Fragment OpEntryPoint operand ",0x1e);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,
                                   " with Input interfaces with integer or float type must have a Flat decoration for Entry Point id "
                                   ,0x61);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                        lVar55 = 1;
                        pcVar61 = ".";
                        goto LAB_002d38af;
                      }
                    }
                    goto LAB_002d430e;
                  }
                }
                else {
LAB_002d430e:
                  iVar25 = 0;
                }
              }
LAB_002d32cf:
              if (iVar25 != 0) goto LAB_002d4373;
            }
            iVar25 = 6;
LAB_002d4373:
            pIVar63 = local_4d8;
            in_RCX = (ValidationState_t *)((ulong)local_508 & 0xffffffff);
            if (iVar25 == 6) {
              if ((1 < (int)local_5bc) || (1 < (int)local_508)) {
                in_RCX = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar28);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,
                           (Instruction *)in_RCX);
                lVar55 = 0xa9;
                pcVar61 = 
                "There must be at most one object per Storage Class that can contain a structure type containing members decorated with BuiltIn, consumed per entry-point. Entry Point id "
                ;
                goto LAB_002d45fe;
              }
              local_3f8._0_4_ = MVar28;
              pmVar36 = std::
                        map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                        ::operator[](local_538,(key_type_conflict *)local_3f8);
              p_Var38 = (__hashtable *)
                        (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
              p_Var58 = (__hashtable *)&(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
              bVar68 = p_Var38 == p_Var58;
              p_Var18 = p_Var58;
              p_Var17 = __h;
              while (__h = p_Var18, iVar25 = 0xc, !bVar68) {
                fVar5 = (p_Var38->_M_rehash_policy)._M_max_load_factor;
                if (fVar5 == 5.74532e-44) {
                  uVar62 = (ulong)local_628 >> 8;
                  local_628 = (MatrixLayout *)CONCAT71((int7)uVar62,bVar68);
                  p_Var57 = (__node_base_ptr)(p_Var38->_M_rehash_policy)._M_next_resize;
                  p_Var10 = p_Var38->_M_single_bucket;
                  linkage_name._M_dataplus._M_p = (pointer)&linkage_name.field_2;
                  linkage_name._M_string_length = 0;
                  linkage_name.field_2._M_allocated_capacity =
                       linkage_name.field_2._M_allocated_capacity & 0xffffffffffffff00;
                  bVar19 = p_Var57 == p_Var10;
                  if (bVar19) {
                    bVar20 = false;
                  }
                  else {
                    bVar20 = false;
                    do {
                      uVar26 = *(uint *)&p_Var57->_M_nxt;
                      bVar59 = 0;
                      bVar66 = false;
                      uVar62 = 0;
                      do {
                        if ((char)(uVar26 >> (bVar59 & 0x1f)) == '\0') {
                          bVar20 = true;
                          break;
                        }
                        std::__cxx11::string::push_back((char)&linkage_name);
                        bVar66 = 2 < uVar62;
                        uVar62 = uVar62 + 1;
                        bVar59 = bVar59 + 8;
                      } while (uVar62 != 4);
                      if (!bVar66) break;
                      p_Var57 = (__node_base_ptr)((long)&p_Var57->_M_nxt + 4);
                      bVar19 = p_Var57 == p_Var10;
                    } while (!bVar19);
                  }
                  pIVar63 = local_4d8;
                  if (bVar19) {
                    __assert_fail("!assert_found_terminating_null && \"Did not find terminating null for the string.\""
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/string_utils.h"
                                  ,0x65,
                                  "std::string spvtools::utils::MakeString(InputIt, InputIt, bool) [InputIt = __gnu_cxx::__normal_iterator<const unsigned int *, std::vector<unsigned int>>]"
                                 );
                  }
                  if ((!bVar20) &&
                     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2)) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
                  pIVar37 = ValidationState_t::FindDef(vstate,MVar28);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar37);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"The LinkageAttributes Decoration (Linkage name: "
                             ,0x30);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,") cannot be applied to function id ",0x23);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,
                             " because it is targeted by an OpEntryPoint instruction.",0x37);
                  local_5f0 = (__node_base *)(ulong)(uint)local_228;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  p_Var58 = __h;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                    p_Var58 = __h;
                  }
                }
                in_RCX = (ValidationState_t *)(ulong)(uint)fVar5;
                if (fVar5 == 5.74532e-44) {
                  iVar25 = 1;
                  p_Var17 = __h;
                  break;
                }
                p_Var38 = (__hashtable *)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var38);
                p_Var18 = __h;
                p_Var17 = __h;
                bVar68 = p_Var38 == p_Var58;
              }
              __h = p_Var17;
              if (bVar68 != false) {
                bVar68 = EnumSet<spv::Capability>::contains
                                   (local_4e8,WorkgroupMemoryExplicitLayoutKHR);
                if ((((!bVar68) ||
                     (bVar19 = EnumSet<spv::Capability>::contains(local_4e8,UntypedPointersKHR),
                     bVar19)) || ((int)local_500 < 1)) || (local_574 < 1)) {
                  iVar25 = 0;
                  if (!bVar68 && 0 < local_574) {
                    in_RCX = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar28);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,
                               (Instruction *)in_RCX);
                    lVar55 = 0x81;
                    pcVar61 = 
                    "Workgroup Storage Class variables can\'t be decorated with Block unless declaring the WorkgroupMemoryExplicitLayoutKHR capability."
                    ;
                    goto LAB_002d461d;
                  }
                }
                else if ((int)local_500 == local_574) {
                  if (local_574 < 2) {
                    iVar25 = 0;
                  }
                  else {
                    iVar25 = 0;
                    if (local_574 != local_4ec) {
                      in_RCX = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar28);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,
                                 (Instruction *)in_RCX);
                      lVar55 = 0x120;
                      pcVar61 = 
                      "When declaring WorkgroupMemoryExplicitLayoutKHR, if more than one Workgroup Storage Class variable in the entry point interface point to a type decorated with Block, all of them must be decorated with Aliased (unless the UntypedPointerWorkgroupKHR capability is declared). Entry point id "
                      ;
                      goto LAB_002d45fe;
                    }
                  }
                }
                else {
                  in_RCX = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar28);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,
                             (Instruction *)in_RCX);
                  lVar55 = 0x102;
                  pcVar61 = 
                  "When declaring WorkgroupMemoryExplicitLayoutKHR, either all or none of the Workgroup Storage Class variables in the entry point interface must point to struct types decorated with Block (unless the UntypedPointersKHR capability is declared).  Entry point id "
                  ;
LAB_002d45fe:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar61,lVar55);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  lVar55 = 0x20;
                  pcVar61 = " does not meet this requirement.";
LAB_002d461d:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar61,lVar55);
                  local_5f0 = (__node_base *)(ulong)(uint)local_228;
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  iVar25 = 1;
                }
              }
            }
            std::
            _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&output_var_builtin._M_h);
            std::
            _Hashtable<spv::BuiltIn,_spv::BuiltIn,_std::allocator<spv::BuiltIn>,_std::__detail::_Identity,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&input_var_builtin._M_h);
            std::
            _Hashtable<spvtools::val::Instruction_*,_spvtools::val::Instruction_*,_std::allocator<spvtools::val::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::val::Instruction_*>,_std::hash<spvtools::val::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&seen_vars._M_h);
            if (iVar25 != 0) goto LAB_002d47d0;
            pEVar64 = (pointer)((long)pIVar63 + 0x38);
            uVar23 = (int)local_508;
          } while (pEVar64 != pEVar9);
          iVar25 = 4;
        }
LAB_002d47d0:
        if (iVar25 != 4) {
          local_61c = (spv_result_t)local_5f0;
          if (iVar25 == 2) {
            local_61c = SPV_SUCCESS;
          }
          goto LAB_002d47f7;
        }
        pMVar40 = pMVar40 + 1;
      } while (pMVar40 != local_460);
    }
    local_61c = SPV_SUCCESS;
LAB_002d47f7:
    if (local_61c == SPV_SUCCESS) {
      seen_vars._M_h._M_buckets = &seen_vars._M_h._M_single_bucket;
      seen_vars._M_h._M_bucket_count = 1;
      seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      seen_vars._M_h._M_element_count = 0;
      seen_vars._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
      seen_vars._M_h._M_single_bucket = (__node_base_ptr)0x0;
      pIVar63 = (vstate->ordered_instructions_).
                super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_4d8 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar63 != local_4d8) {
        local_4f8 = (_Base_ptr)&vstate->module_capabilities_;
        local_500 = &vstate->id_decorations_;
        __h = &(vstate->pointer_to_uniform_block_)._M_h;
        __h_1 = &(vstate->struct_for_uniform_block_)._M_h;
        do {
          pIVar37 = ValidationState_t::FindDef(vstate,(pIVar63->inst_).type_id);
          input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_single_bucket;
          input_var_builtin._M_h._M_bucket_count = 1;
          input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          input_var_builtin._M_h._M_element_count = 0;
          input_var_builtin._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
          input_var_builtin._M_h._M_single_bucket = (__node_base_ptr)0x0;
          uVar3 = (pIVar63->inst_).opcode;
          if ((uVar3 == 0x1142) || (uVar3 == 0x3b)) {
            uVar26 = (pIVar63->inst_).result_id;
            this = (anon_unknown_0 *)(ulong)uVar26;
            uVar6 = (pIVar63->words_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[3];
            bVar68 = spvIsVulkanEnv(vstate->context_->target_env);
            if (bVar68) {
              if (uVar6 == 9) {
                ValidationState_t::EntryPointReferences
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,vstate,uVar26);
                bVar68 = (size_type *)output_var_builtin._M_h._M_element_count ==
                         &output_var_builtin._M_h._M_bucket_count;
                p_Var39 = (_Rb_tree_node_base *)output_var_builtin._M_h._M_element_count;
                while (cVar69 = '\0', !bVar68) {
                  uVar62 = (ulong)_ep_id >> 0x20;
                  _ep_id = (char *)CONCAT44((int)uVar62,p_Var39[1]._M_color);
                  local_3f8 = (undefined1  [8])&seen_vars;
                  pVar72 = std::
                           _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                           ::
                           _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                     ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                       *)local_3f8,&ep_id,(DiagnosticStream *)local_3f8);
                  if (((undefined1  [16])pVar72 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                    in_RCX = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a12,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"Entry point id \'",0x10);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "\' uses more than one PushConstant interface.\n",0x2d);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,
                               "There must be no more than one push constant block ",0x33);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"statically used per shader entry point.",0x27);
                    local_628 = (MatrixLayout *)(ulong)(uint)local_228;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                      operator_delete(linkage_name._M_dataplus._M_p,
                                      linkage_name.field_2._M_allocated_capacity + 1);
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  }
                  if (((undefined1  [16])pVar72 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                    cVar69 = '\x01';
                    break;
                  }
                  p_Var39 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var39);
                  bVar68 = p_Var39 == (_Rb_tree_node_base *)&output_var_builtin._M_h._M_bucket_count
                  ;
                }
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,
                           (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                if (bVar68) goto LAB_002d4d0c;
              }
              else {
LAB_002d4d0c:
                if (uVar6 != 0) goto LAB_002d4ef4;
                ValidationState_t::EntryPointReferences
                          ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,vstate,uVar26);
                if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
                   (bVar68 = anon_unknown_0::hasDecoration(this,0x22,decoration,in_RCX), bVar68)) {
                  bVar68 = true;
                  if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
                     (bVar19 = anon_unknown_0::hasDecoration(this,0x21,decoration,in_RCX), !bVar19))
                  {
                    pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                    in_RCX = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0)
                    ;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                               linkage_name._M_string_length);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"UniformConstant id \'",0x14);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    lVar55 = 0x21;
                    pcVar61 = "\' is missing Binding decoration.\n";
                    goto LAB_002d4e6c;
                  }
                }
                else {
                  pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                  in_RCX = (ValidationState_t *)0x0;
                  ValidationState_t::VkErrorID_abi_cxx11_(&linkage_name,vstate,0x1a15,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"UniformConstant id \'",0x14);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  lVar55 = 0x27;
                  pcVar61 = "\' is missing DescriptorSet decoration.\n";
LAB_002d4e6c:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,pcVar61,lVar55);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,
                             "These variables must have DescriptorSet and Binding decorations specified"
                             ,0x49);
                  local_628 = (MatrixLayout *)(ulong)(uint)local_228;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  bVar68 = false;
                }
                std::
                _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&output_var_builtin,
                           (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                cVar69 = '\x01';
                if (bVar68) goto LAB_002d4ef4;
              }
            }
            else {
LAB_002d4ef4:
              bVar68 = spvIsOpenGLEnv(vstate->context_->target_env);
              if (bVar68) {
                bVar68 = anon_unknown_0::hasDecoration(this,2,decoration,in_RCX);
                bVar19 = anon_unknown_0::hasDecoration(this,3,decoration,in_RCX);
                if ((uVar6 == 0xc && bVar68) || (bVar20 = true, uVar6 == 2 && (bVar68 || bVar19))) {
                  ValidationState_t::EntryPointReferences
                            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&output_var_builtin,vstate,uVar26);
                  bVar20 = true;
                  if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
                     (bVar68 = anon_unknown_0::hasDecoration(this,0x21,decoration,in_RCX), !bVar68))
                  {
                    pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                    pcVar61 = "Storage Buffer";
                    in_RCX = (ValidationState_t *)0x3578a1;
                    if (uVar6 == 2) {
                      pcVar61 = "Uniform";
                    }
                    linkage_name._M_dataplus._M_p = pcVar61;
                    pDVar42 = DiagnosticStream::operator<<
                                        ((DiagnosticStream *)local_3f8,(char **)&linkage_name);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar42," id \'",5);
                    std::ostream::_M_insert<unsigned_long>((ulong)pDVar42);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar42,"\' is missing Binding decoration.\n",0x21);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar42,"From ARB_gl_spirv extension:\n",0x1d);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar42,"Uniform and shader storage block variables must "
                               ,0x30);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)pDVar42,"also be decorated with a *Binding*.",0x23);
                    local_628 = (MatrixLayout *)(ulong)(uint)pDVar42->error_;
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    bVar20 = false;
                  }
                  std::
                  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                  ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                              *)&output_var_builtin,
                             (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                }
                cVar69 = '\x01';
                if (!bVar20) goto LAB_002d5c40;
              }
              if (uVar6 == 4) {
                bVar68 = EnumSet<spv::Capability>::contains
                                   ((EnumSet<spv::Capability> *)local_4f8,
                                    WorkgroupMemoryExplicitLayoutKHR);
              }
              else {
                bVar68 = false;
              }
              if ((bVar68 != false) ||
                 (((uVar6 < 0xd && ((0x1204U >> (uVar6 & 0x1f) & 1) != 0)) ||
                  (cVar69 = '\0', uVar6 == 0x14e5)))) {
                pIVar37 = ValidationState_t::FindDef
                                    (vstate,(pIVar63->words_).
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_start[1]);
                uVar4 = (pIVar37->inst_).opcode;
                if ((uVar4 != 0x20) && (uVar4 != 0x1141)) {
                  __assert_fail("spv::Op::OpTypePointer == ptrInst->opcode() || spv::Op::OpTypeUntypedPointerKHR == ptrInst->opcode()"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                                ,0x4b7,
                                "spv_result_t spvtools::val::(anonymous namespace)::CheckDecorationsOfBuffers(ValidationState_t &)"
                               );
                }
                if (uVar3 == 0x1142) {
                  puVar11 = (pIVar63->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  in_RCX = (ValidationState_t *)
                           ((long)(pIVar63->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar11);
                  MVar28 = kRowMajor;
                  if ((ValidationState_t *)0x10 < in_RCX) {
                    pMVar40 = puVar11 + 4;
                    goto LAB_002d5157;
                  }
                }
                else {
                  pMVar40 = (pIVar37->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start + 3;
LAB_002d5157:
                  MVar28 = *pMVar40;
                }
                if (MVar28 != kRowMajor) {
                  pIVar41 = ValidationState_t::FindDef(vstate,MVar28);
                  if ((bVar68 == false) &&
                     (uVar51 = (pIVar41->inst_).opcode & 0xfffffffe,
                     in_RCX = (ValidationState_t *)(ulong)uVar51, (short)uVar51 == 0x1c)) {
                    MVar28 = Instruction::GetOperandAs<unsigned_int>(pIVar41,1);
                    pIVar41 = ValidationState_t::FindDef(vstate,MVar28);
                  }
                  cVar69 = '\x03';
                  if ((pIVar41->inst_).opcode != 0x1e) goto LAB_002d5c40;
                  local_3f8._0_4_ = kColumnMajor;
                  local_3f8._4_4_ = 0;
                  anon_unknown_0::ComputeMemberConstraintsForStruct
                            ((MemberConstraints *)&input_var_builtin,MVar28,
                             (LayoutConstraints *)local_3f8,vstate);
                }
                _ep_id = "ConstantDataStorageBuffer";
                if (bVar68 != false) {
                  _ep_id = "Function or Workgroup";
                }
                _ep_id = _ep_id + 0xc;
                if (uVar6 == 9) {
                  _ep_id = "PushConstant";
                }
                in_RCX = (ValidationState_t *)0x3578a1;
                if (uVar6 == 2) {
                  _ep_id = "Uniform";
                }
                bVar19 = spvIsVulkanEnv(vstate->context_->target_env);
                if (bVar19) {
                  bVar19 = anon_unknown_0::hasDecoration
                                     ((anon_unknown_0 *)(ulong)MVar28,2,decoration,in_RCX);
                  bVar20 = anon_unknown_0::hasDecoration
                                     ((anon_unknown_0 *)(ulong)MVar28,3,decoration,in_RCX);
                  if ((uVar6 != 0xc) || (!bVar20)) {
                    if (uVar6 == 9 && !bVar19) {
                      pIVar41 = ValidationState_t::FindDef(vstate,MVar28);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar41);
                      in_RCX = (ValidationState_t *)0x0;
                      ValidationState_t::VkErrorID_abi_cxx11_
                                ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                 output_var_builtin._M_h._M_bucket_count);
                      lVar55 = 0x11;
                      pcVar61 = "PushConstant id \'";
LAB_002d5544:
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,pcVar61,lVar55);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"\' is missing Block decoration.\n",0x1f);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                      lVar55 = 0x39;
                      pcVar61 = "Such variables must be identified with a Block decoration";
                      goto LAB_002d558b;
                    }
                    if (uVar6 == 0xc && !bVar19) {
                      pIVar41 = ValidationState_t::FindDef(vstate,MVar28);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar41);
                      in_RCX = (ValidationState_t *)0x0;
                      ValidationState_t::VkErrorID_abi_cxx11_
                                ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                 output_var_builtin._M_h._M_bucket_count);
                      lVar55 = 0x12;
                      pcVar61 = "StorageBuffer id \'";
                      goto LAB_002d5544;
                    }
                    in_RCX = (ValidationState_t *)CONCAT71((int7)((ulong)in_RCX >> 8),uVar6 != 2);
                    if ((!bVar19 && !bVar20) && uVar6 == 2) {
                      pIVar41 = ValidationState_t::FindDef(vstate,MVar28);
                      ValidationState_t::diag
                                ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar41);
                      in_RCX = (ValidationState_t *)0x0;
                      ValidationState_t::VkErrorID_abi_cxx11_
                                ((string *)&output_var_builtin,vstate,0x1a14,(char *)0x0);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                 output_var_builtin._M_h._M_bucket_count);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"Uniform id \'",0xc);
                      std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,
                                 "\' is missing Block or BufferBlock decoration.\n",0x2e);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_3f8,"From Vulkan spec:\n",0x12);
                      lVar55 = 0x48;
                      pcVar61 = 
                      "Such variables must be identified with a Block or BufferBlock decoration";
                      goto LAB_002d558b;
                    }
                    if ((uVar6 == 0xc) || (bVar19 = true, uVar6 == 2)) {
                      ValidationState_t::EntryPointReferences
                                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&output_var_builtin,vstate,uVar26);
                      if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize == 0) ||
                         (bVar19 = anon_unknown_0::hasDecoration(this,0x22,decoration,in_RCX),
                         bVar19)) {
                        bVar19 = true;
                        if ((output_var_builtin._M_h._M_rehash_policy._M_next_resize != 0) &&
                           (bVar20 = anon_unknown_0::hasDecoration(this,0x21,decoration,in_RCX),
                           !bVar20)) {
                          pIVar41 = ValidationState_t::FindDef(vstate,uVar26);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     pIVar41);
                          in_RCX = (ValidationState_t *)0x0;
                          ValidationState_t::VkErrorID_abi_cxx11_
                                    (&linkage_name,vstate,0x1a15,(char *)0x0);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                     linkage_name._M_string_length);
                          pDVar42 = DiagnosticStream::operator<<
                                              ((DiagnosticStream *)local_3f8,(char **)&ep_id);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)pDVar42," id \'",5);
                          std::ostream::_M_insert<unsigned_long>((ulong)pDVar42);
                          lVar55 = 0x21;
                          pcVar61 = "\' is missing Binding decoration.\n";
                          goto LAB_002d5efd;
                        }
                      }
                      else {
                        pIVar41 = ValidationState_t::FindDef(vstate,uVar26);
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar41
                                  );
                        in_RCX = (ValidationState_t *)0x0;
                        ValidationState_t::VkErrorID_abi_cxx11_
                                  (&linkage_name,vstate,0x1a15,(char *)0x0);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        pDVar42 = DiagnosticStream::operator<<
                                            ((DiagnosticStream *)local_3f8,(char **)&ep_id);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar42," id \'",5);
                        std::ostream::_M_insert<unsigned_long>((ulong)pDVar42);
                        lVar55 = 0x27;
                        pcVar61 = "\' is missing DescriptorSet decoration.\n";
LAB_002d5efd:
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar42,pcVar61,lVar55);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar42,"From Vulkan spec:\n",0x12);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar42,
                                   "These variables must have DescriptorSet and Binding decorations specified"
                                   ,0x49);
                        local_628 = (MatrixLayout *)(ulong)(uint)pDVar42->error_;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                          operator_delete(linkage_name._M_dataplus._M_p,
                                          linkage_name.field_2._M_allocated_capacity + 1);
                        }
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        bVar19 = false;
                      }
                      std::
                      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                      ::_M_erase((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                  *)&output_var_builtin,
                                 (_Link_type)output_var_builtin._M_h._M_before_begin._M_nxt);
                    }
                  }
                  else {
                    pIVar41 = ValidationState_t::FindDef(vstate,uVar26);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar41);
                    in_RCX = (ValidationState_t *)0x0;
                    ValidationState_t::VkErrorID_abi_cxx11_
                              ((string *)&output_var_builtin,vstate,0x1a13,(char *)0x0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                               output_var_builtin._M_h._M_bucket_count);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,"Storage buffer id \'",0x13);
                    std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                    lVar55 = 0x55;
                    pcVar61 = 
                    " In Vulkan, BufferBlock is disallowed on variables in the StorageBuffer storage class"
                    ;
LAB_002d558b:
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,pcVar61,lVar55);
                    local_628 = (MatrixLayout *)(ulong)(uint)local_228;
                    if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                        &output_var_builtin._M_h._M_before_begin) {
                      operator_delete(output_var_builtin._M_h._M_buckets,
                                      (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt
                                                     )->_M_nxt + 1));
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    bVar19 = false;
                  }
                  cVar69 = '\x01';
                  if (!bVar19) goto LAB_002d5c40;
                }
                cVar69 = '\0';
                if (MVar28 != kRowMajor) {
                  local_3f8._0_4_ = MVar28;
                  pmVar36 = std::
                            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                            ::operator[](local_500,(key_type_conflict *)local_3f8);
                  in_RCX = (ValidationState_t *)
                           (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                  local_508 = (ValidationState_t *)&(pmVar36->_M_t)._M_impl.super__Rb_tree_header;
                  cVar69 = '\0';
                  if (in_RCX != local_508) {
                    local_538 = (map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                                 *)((ulong)bVar68 | 0x28);
                    do {
                      bVar20 = uVar6 == 2;
                      iVar25 = in_RCX->generator_;
                      bVar66 = iVar25 == 2;
                      bVar19 = true;
                      if ((((iVar25 != 3 || !bVar20) && (bVar19 = bVar66, bVar68 == false)) &&
                          (uVar6 != 9)) && ((uVar6 != 0x14e5 && (uVar6 != 0xc)))) {
                        bVar19 = false;
                      }
                      pVVar33 = in_RCX;
                      if (bVar20 && bVar66) {
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,
                                      (pIVar37->inst_).result_id);
                        local_3f8 = (undefined1  [8])__h;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)__h,&output_var_builtin,local_3f8);
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar28);
                        local_3f8 = (undefined1  [8])__h_1;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)__h_1,&output_var_builtin,local_3f8);
                      }
                      if (iVar25 == 3 && bVar20 || iVar25 == 2 && (uVar6 == 0xc || uVar6 == 0x14e5))
                      {
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,
                                      (pIVar37->inst_).result_id);
                        local_3f8 = (undefined1  [8])&vstate->pointer_to_storage_buffer_;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&vstate->pointer_to_storage_buffer_,&output_var_builtin,
                                   local_3f8);
                        output_var_builtin._M_h._M_buckets =
                             (__buckets_ptr)
                             CONCAT44(output_var_builtin._M_h._M_buckets._4_4_,MVar28);
                        local_3f8 = (undefined1  [8])&vstate->struct_for_storage_buffer_;
                        std::
                        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        ::
                        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                    *)&vstate->struct_for_storage_buffer_,&output_var_builtin,
                                   local_3f8);
                      }
                      bVar67 = true;
                      if ((bool)((bVar20 && bVar66) | bVar19)) {
                        pcVar61 = "BufferBlock";
                        if (iVar25 == 2) {
                          pcVar61 = "Block";
                        }
                        bVar67 = *(bool *)((long)&(vstate->options_->universal_limits_).
                                                  max_struct_members +
                                          (long)&(local_538->_M_t)._M_impl);
                        output_var_builtin._M_h._M_buckets = (__buckets_ptr)pcVar61;
                        bVar21 = anon_unknown_0::isMissingOffsetInStruct(MVar28,vstate);
                        if (bVar21) {
                          pVVar33 = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar28);
                          ValidationState_t::diag
                                    ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                     (Instruction *)pVVar33);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8,"Structure id ",0xd);
                          std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)local_3f8," decorated as ",0xe);
                          pDVar42 = DiagnosticStream::operator<<
                                              ((DiagnosticStream *)local_3f8,
                                               (char **)&output_var_builtin);
                          lVar55 = 0x35;
                          pcVar61 = " must be explicitly laid out with Offset decorations.";
                        }
                        else {
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Tuple_impl<1UL,_unsigned_int>.
                          super__Head_base<1UL,_unsigned_int,_false>._M_head_impl =
                               (_Head_base<1UL,_unsigned_int,_false>)0x0;
                          k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
                          super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl =
                               RelaxedPrecision;
                          local_558._8_8_ =
                               std::
                               _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1329:23)>
                               ::_M_invoke;
                          local_558._0_8_ =
                               std::
                               _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1329:23)>
                               ::_M_manager;
                          bVar21 = anon_unknown_0::checkForRequiredDecoration
                                             (MVar28,(function<bool_(spv::Decoration)> *)&k,
                                              OpTypeArray,vstate);
                          if ((code *)local_558._0_8_ != (code *)0x0) {
                            (*(code *)local_558._0_8_)
                                      ((function<bool_(spv::Decoration)> *)&k,
                                       (function<bool_(spv::Decoration)> *)&k,3);
                          }
                          if (bVar21) {
                            var_instr = (Instruction *)0x0;
                            _uStack_520 = 0;
                            local_510 = std::
                                        _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1341:23)>
                                        ::_M_invoke;
                            local_518 = std::
                                        _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1341:23)>
                                        ::_M_manager;
                            bVar21 = anon_unknown_0::checkForRequiredDecoration
                                               (MVar28,(function<bool_(spv::Decoration)> *)
                                                       &var_instr,OpTypeMatrix,vstate);
                            if (local_518 != (code *)0x0) {
                              (*local_518)((_Any_data *)&var_instr,(_Any_data *)&var_instr,
                                           __destroy_functor);
                            }
                            if (bVar21) {
                              _builtin = (void *)0x0;
                              uStack_480 = 0;
                              local_470 = std::
                                          _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1353:23)>
                                          ::_M_invoke;
                              local_478 = std::
                                          _Function_handler<bool_(spv::Decoration),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp:1353:23)>
                                          ::_M_manager;
                              pVVar33 = vstate;
                              bVar21 = anon_unknown_0::checkForRequiredDecoration
                                                 (MVar28,(function<bool_(spv::Decoration)> *)
                                                         &builtin,OpTypeMatrix,vstate);
                              if (local_478 != (code *)0x0) {
                                (*local_478)((_Any_data *)&builtin,(_Any_data *)&builtin,
                                             __destroy_functor);
                              }
                              if (bVar21) {
                                bVar21 = spvIsVulkanEnv(vstate->context_->target_env);
                                if (bVar21) {
                                  if (bVar20 && bVar66) {
                                    pVVar33 = (ValidationState_t *)0x1;
                                    sVar29 = anon_unknown_0::checkLayout
                                                       (MVar28,_ep_id,
                                                        (char *)output_var_builtin._M_h._M_buckets,
                                                        true,bVar67,0,
                                                        (MemberConstraints *)&input_var_builtin,
                                                        vstate);
                                    if (sVar29 == SPV_SUCCESS) goto LAB_002d5a0f;
LAB_002d5a56:
                                    bVar67 = false;
                                    local_628 = (MatrixLayout *)(ulong)(uint)sVar29;
                                    goto LAB_002d5c09;
                                  }
LAB_002d5a0f:
                                  if (bVar19) {
                                    pVVar33 = (ValidationState_t *)0x0;
                                    sVar29 = anon_unknown_0::checkLayout
                                                       (MVar28,_ep_id,
                                                        (char *)output_var_builtin._M_h._M_buckets,
                                                        false,bVar67,0,
                                                        (MemberConstraints *)&input_var_builtin,
                                                        vstate);
                                    if (sVar29 != SPV_SUCCESS) goto LAB_002d5a56;
                                  }
                                }
                                bVar67 = true;
                                goto LAB_002d5c09;
                              }
                              pVVar33 = (ValidationState_t *)
                                        ValidationState_t::FindDef(vstate,MVar28);
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                         (Instruction *)pVVar33);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,"Structure id ",0xd);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8," decorated as ",0xe);
                              pDVar42 = DiagnosticStream::operator<<
                                                  ((DiagnosticStream *)local_3f8,
                                                   (char **)&output_var_builtin);
                              lVar55 = 0x43;
                              pcVar61 = 
                              " must be explicitly laid out with RowMajor or ColMajor decorations.";
                            }
                            else {
                              pVVar33 = (ValidationState_t *)
                                        ValidationState_t::FindDef(vstate,MVar28);
                              ValidationState_t::diag
                                        ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                         (Instruction *)pVVar33);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8,"Structure id ",0xd);
                              std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)local_3f8," decorated as ",0xe);
                              pDVar42 = DiagnosticStream::operator<<
                                                  ((DiagnosticStream *)local_3f8,
                                                   (char **)&output_var_builtin);
                              lVar55 = 0x3b;
                              pcVar61 = 
                              " must be explicitly laid out with MatrixStride decorations.";
                            }
                          }
                          else {
                            pVVar33 = (ValidationState_t *)ValidationState_t::FindDef(vstate,MVar28)
                            ;
                            ValidationState_t::diag
                                      ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,
                                       (Instruction *)pVVar33);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8,"Structure id ",0xd);
                            std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_3f8," decorated as ",0xe);
                            pDVar42 = DiagnosticStream::operator<<
                                                ((DiagnosticStream *)local_3f8,
                                                 (char **)&output_var_builtin);
                            lVar55 = 0x3a;
                            pcVar61 = " must be explicitly laid out with ArrayStride decorations.";
                          }
                        }
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar42,pcVar61,lVar55);
                        local_628 = (MatrixLayout *)(ulong)(uint)pDVar42->error_;
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        bVar67 = false;
                      }
LAB_002d5c09:
                      if (!bVar67) {
                        in_RCX = pVVar33;
                        cVar69 = '\x01';
                        break;
                      }
                      in_RCX = (ValidationState_t *)
                               std::_Rb_tree_increment((_Rb_tree_node_base *)in_RCX);
                    } while (in_RCX != local_508);
                  }
                }
              }
            }
LAB_002d5c40:
            _Var15._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
            if (cVar69 == '\0') goto LAB_002d5c4c;
          }
          else {
            if (((pIVar37 == (Instruction *)0x0) || ((pIVar37->inst_).opcode != 0x20)) ||
               (SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar37,1),
               SVar22 != PhysicalStorageBuffer)) {
              bVar68 = EnumSet<spv::Capability>::contains
                                 ((EnumSet<spv::Capability> *)local_4f8,UntypedPointersKHR);
              if ((bVar68) && (bVar68 = spvIsVulkanEnv(vstate->context_->target_env), bVar68)) {
                uVar2 = (pIVar63->inst_).opcode;
                uVar26 = uVar2 - 0x1143;
                in_RCX = (ValidationState_t *)(ulong)uVar26;
                if (uVar26 < 7) {
                  if ((0x33U >> (uVar26 & 0x1f) & 1) == 0) {
                    if (uVar26 != 6) goto LAB_002d5d07;
                    uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar63,3);
                    pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                    uVar30 = (pIVar37->inst_).type_id;
                  }
                  else {
                    uVar30 = (pIVar63->inst_).type_id;
                  }
                  uVar27 = Instruction::GetOperandAs<unsigned_int>(pIVar63,2);
                }
                else {
LAB_002d5d07:
                  uVar27 = 0;
                  if (uVar2 == 0x3d) {
                    uVar30 = ValidationState_t::GetOperandTypeId(vstate,pIVar63,2);
                    OVar31 = ValidationState_t::GetIdOpcode(vstate,uVar30);
                    uVar30 = 0;
                    if (OVar31 == OpTypeUntypedPointerKHR) {
                      uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar63,2);
                      pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                      uVar30 = (pIVar37->inst_).type_id;
                      uVar27 = (pIVar63->inst_).type_id;
                    }
                  }
                  else {
                    uVar30 = 0;
                    if (uVar2 == 0x3e) {
                      uVar27 = 0;
                      uVar30 = ValidationState_t::GetOperandTypeId(vstate,pIVar63,0);
                      OVar31 = ValidationState_t::GetIdOpcode(vstate,uVar30);
                      uVar30 = 0;
                      if (OVar31 == OpTypeUntypedPointerKHR) {
                        uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar63,0);
                        pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
                        uVar30 = (pIVar37->inst_).type_id;
                        uVar27 = ValidationState_t::GetOperandTypeId(vstate,pIVar63,1);
                      }
                    }
                  }
                }
                cVar69 = '\x03';
                if ((uVar27 != 0) && (uVar30 != 0)) {
                  pIVar37 = ValidationState_t::FindDef(vstate,uVar30);
                  SVar22 = Instruction::GetOperandAs<spv::StorageClass>(pIVar37,1);
                  pcVar61 = "Uniform";
                  bVar68 = SVar22 != Uniform;
                  if ((bVar68) &&
                     ((pcVar61 = "PushConstant", SVar22 != PushConstant &&
                      (pcVar61 = "StorageBuffer", SVar22 == Workgroup)))) {
                    pcVar61 = "Workgroup";
                  }
                  pIVar37 = ValidationState_t::FindDef(vstate,uVar27);
                  bVar19 = (&vstate->options_->scalar_block_layout)[SVar22 == Workgroup];
                  if ((pIVar37->inst_).opcode == 0x1e) {
                    if (SVar22 == Uniform) {
                      bVar68 = ValidationState_t::HasDecoration(vstate,uVar27,BufferBlock);
                    }
                    local_3f8._0_4_ = kColumnMajor;
                    local_3f8._4_4_ = 0;
                    anon_unknown_0::ComputeMemberConstraintsForStruct
                              ((MemberConstraints *)&input_var_builtin,uVar27,
                               (LayoutConstraints *)local_3f8,vstate);
                  }
                  decoration_str = "BufferBlock";
                  if (SVar22 != Uniform) {
                    decoration_str = "Block";
                  }
                  if (bVar68 == false) {
                    decoration_str = "Block";
                  }
                  sVar29 = anon_unknown_0::checkLayout
                                     (uVar27,pcVar61,decoration_str,(bool)(bVar68 ^ 1),bVar19,0,
                                      (MemberConstraints *)&input_var_builtin,vstate);
                  cVar69 = sVar29 != SPV_SUCCESS;
                  if ((bool)cVar69) {
                    local_628._0_4_ = sVar29;
                  }
                  in_RCX = (ValidationState_t *)(ulong)(uint)(spv_result_t)local_628;
                  local_628 = (MatrixLayout *)(ulong)(uint)(spv_result_t)local_628;
                }
                _Var15._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
                if (cVar69 != '\0') goto joined_r0x002d5c59;
              }
            }
            else {
              uVar26 = Instruction::GetOperandAs<unsigned_int>(pIVar37,2);
              pIVar37 = ValidationState_t::FindDef(vstate,uVar26);
              bVar68 = vstate->options_->scalar_block_layout;
              if ((pIVar37->inst_).opcode == 0x1e) {
                local_3f8._0_4_ = kColumnMajor;
                local_3f8._4_4_ = 0;
                anon_unknown_0::ComputeMemberConstraintsForStruct
                          ((MemberConstraints *)&input_var_builtin,uVar26,
                           (LayoutConstraints *)local_3f8,vstate);
              }
              sVar29 = anon_unknown_0::checkLayout
                                 (uVar26,"PhysicalStorageBuffer","Block",false,bVar68,0,
                                  (MemberConstraints *)&input_var_builtin,vstate);
              cVar69 = '\x01';
              if (sVar29 != SPV_SUCCESS) {
                local_628._0_4_ = sVar29;
              }
              in_RCX = (ValidationState_t *)(ulong)(uint)(spv_result_t)local_628;
              local_628 = (MatrixLayout *)(ulong)(uint)(spv_result_t)local_628;
              _Var15 = input_var_builtin._M_h._M_before_begin;
              if (sVar29 != SPV_SUCCESS) goto joined_r0x002d5c59;
            }
LAB_002d5c4c:
            cVar69 = '\0';
            _Var15._M_nxt = input_var_builtin._M_h._M_before_begin._M_nxt;
          }
joined_r0x002d5c59:
          while (_Var15._M_nxt != (_Hash_node_base *)0x0) {
            p_Var12 = (_Var15._M_nxt)->_M_nxt;
            operator_delete(_Var15._M_nxt,0x20);
            _Var15._M_nxt = p_Var12;
          }
          memset(input_var_builtin._M_h._M_buckets,0,input_var_builtin._M_h._M_bucket_count << 3);
          input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          input_var_builtin._M_h._M_element_count = 0;
          if (&input_var_builtin._M_h._M_single_bucket != input_var_builtin._M_h._M_buckets) {
            operator_delete(input_var_builtin._M_h._M_buckets,
                            input_var_builtin._M_h._M_bucket_count << 3);
          }
          if ((cVar69 != '\x03') && (cVar69 != '\0')) {
            goto LAB_002d5f7c;
          }
          pIVar63 = pIVar63 + 1;
        } while (pIVar63 != local_4d8);
      }
      local_628._0_4_ = SPV_SUCCESS;
LAB_002d5f7c:
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&seen_vars);
      local_61c = (spv_result_t)local_628;
      if ((spv_result_t)local_628 == SPV_SUCCESS) {
        seen_vars._M_h._M_element_count = (size_type)&seen_vars._M_h._M_bucket_count;
        sVar29 = SPV_SUCCESS;
        seen_vars._M_h._M_bucket_count = seen_vars._M_h._M_bucket_count & 0xffffffff00000000;
        seen_vars._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        seen_vars._M_h._M_rehash_policy._M_next_resize = 0;
        input_var_builtin._M_h._M_element_count = (size_type)&input_var_builtin._M_h._M_bucket_count
        ;
        input_var_builtin._M_h._M_bucket_count =
             input_var_builtin._M_h._M_bucket_count & 0xffffffff00000000;
        input_var_builtin._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        input_var_builtin._M_h._M_rehash_policy._M_next_resize = 0;
        pIVar63 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pIVar13 = (vstate->ordered_instructions_).
                  super__Vector_base<spvtools::val::Instruction,_std::allocator<spvtools::val::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        input_var_builtin._M_h._M_rehash_policy._0_8_ = input_var_builtin._M_h._M_element_count;
        seen_vars._M_h._M_rehash_policy._0_8_ = seen_vars._M_h._M_element_count;
        if (pIVar63 != pIVar13) {
          do {
            uVar3 = (pIVar63->inst_).opcode;
            if (uVar3 == 0x48) {
              puVar11 = (pIVar63->words_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              id_01._M_head_impl = puVar11[1];
              _Var7._M_head_impl =
                   ((_Head_base<1UL,_unsigned_int,_false> *)(puVar11 + 2))->_M_head_impl;
              uVar27 = puVar11[3];
              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
              super__Head_base<0UL,_spv::Decoration,_false>._M_head_impl = id_01._M_head_impl;
              k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false>.
              _M_head_impl = (_Head_base<1UL,_unsigned_int,_false>)
                             (_Head_base<1UL,_unsigned_int,_false>)_Var7._M_head_impl;
              pVar74 = std::
                       _Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                       ::
                       _M_insert_unique<std::tuple<spv::Decoration,unsigned_int,unsigned_int>const&>
                                 ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::tuple<spv::Decoration,unsigned_int,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int,unsigned_int>>>
                                   *)&input_var_builtin,
                                  (tuple<spv::Decoration,_unsigned_int,_unsigned_int> *)&k);
              if ((((undefined1  [16])pVar74 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (uVar27 != 0x1603)) {
                pIVar37 = ValidationState_t::FindDef(vstate,id_01._M_head_impl);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"ID \'",4);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,"\', member \'",0xb);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,"\' decorated with ",0x11);
                ValidationState_t::SpvDecorationString_abi_cxx11_
                          ((string *)&output_var_builtin,vstate,uVar27);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                           output_var_builtin._M_h._M_bucket_count);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8," multiple times is not allowed.",0x1f);
                sVar29 = local_228;
                if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                    &output_var_builtin._M_h._M_before_begin) {
                  operator_delete(output_var_builtin._M_h._M_buckets,
                                  (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)->
                                                 _M_nxt + 1));
                }
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                iVar25 = 1;
                goto LAB_002d65e5;
              }
              if (uVar27 == 4) {
                uVar30 = 5;
LAB_002d636d:
                var_instr = (Instruction *)CONCAT44(id_01._M_head_impl,_Var7._M_head_impl);
                uStack_520 = uVar30;
                iVar44 = std::
                         _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                         ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                                 *)&input_var_builtin,(key_type *)&var_instr);
                if (iVar44._M_node == (_Base_ptr)&input_var_builtin._M_h._M_bucket_count) {
                  iVar25 = 0;
                }
                else {
                  pIVar37 = ValidationState_t::FindDef(vstate,id_01._M_head_impl);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"ID \'",4)
                  ;
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"\', member \'",0xb);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"\' decorated with both ",0x16);
                  ValidationState_t::SpvDecorationString_abi_cxx11_
                            ((string *)&output_var_builtin,vstate,uVar27);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                             output_var_builtin._M_h._M_bucket_count);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," and ",5)
                  ;
                  ValidationState_t::SpvDecorationString_abi_cxx11_(&linkage_name,vstate,uVar30);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                             linkage_name._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8," is not allowed.",0x10);
                  sVar29 = local_228;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                    operator_delete(linkage_name._M_dataplus._M_p,
                                    linkage_name.field_2._M_allocated_capacity + 1);
                  }
                  if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                      &output_var_builtin._M_h._M_before_begin) {
                    operator_delete(output_var_builtin._M_h._M_buckets,
                                    (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)
                                                   ->_M_nxt + 1));
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  iVar25 = 1;
                }
              }
              else {
                iVar25 = 9;
                if (uVar27 == 5) {
                  uVar30 = 4;
                  goto LAB_002d636d;
                }
              }
              if ((iVar25 == 9) || (iVar25 == 0)) {
                iVar25 = 7;
              }
              if (iVar25 == 7) {
                iVar25 = 0;
              }
LAB_002d65e5:
              if (iVar25 == 0) goto LAB_002d65e9;
            }
            else {
              if (uVar3 == 0x47) {
                puVar11 = (pIVar63->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start;
                p_Var1 = (_Tuple_impl<0UL,_spv::Decoration,_unsigned_int> *)(puVar11 + 1);
                uVar27 = (p_Var1->super__Tuple_impl<1UL,_unsigned_int>).
                         super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
                uVar30 = puVar11[2];
                k.super__Tuple_impl<0UL,_spv::Decoration,_unsigned_int> = *p_Var1;
                pVar73 = std::
                         _Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                         ::_M_insert_unique<std::tuple<spv::Decoration,unsigned_int>const&>
                                   ((_Rb_tree<std::tuple<spv::Decoration,unsigned_int>,std::tuple<spv::Decoration,unsigned_int>,std::_Identity<std::tuple<spv::Decoration,unsigned_int>>,std::less<std::tuple<spv::Decoration,unsigned_int>>,std::allocator<std::tuple<spv::Decoration,unsigned_int>>>
                                     *)&seen_vars,&k);
                if (((((undefined1  [16])pVar73 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                    && (uVar30 != 0x26)) && (uVar30 != 0x1603)) {
                  pIVar37 = ValidationState_t::FindDef(vstate,uVar27);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"ID \'",4)
                  ;
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"\' decorated with ",0x11);
                  ValidationState_t::SpvDecorationString_abi_cxx11_
                            ((string *)&output_var_builtin,vstate,uVar30);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                             output_var_builtin._M_h._M_bucket_count);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8," multiple times is not allowed.",0x1f);
                  sVar29 = local_228;
                  if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                      &output_var_builtin._M_h._M_before_begin) {
                    operator_delete(output_var_builtin._M_h._M_buckets,
                                    (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt)
                                                   ->_M_nxt + 1));
                  }
                  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                  iVar25 = 1;
                }
                else {
                  lVar55 = 0;
                  do {
                    decoration_00 = (&DAT_0036a4c4)[lVar55 * 2];
                    if (((&(anonymous_namespace)::
                           CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                           mutually_exclusive_per_id)[lVar55 * 2] == uVar30) ||
                       (iVar25 = 6, bVar68 = decoration_00 == uVar30,
                       decoration_00 =
                            (&(anonymous_namespace)::
                              CheckDecorationsCompatibility(spvtools::val::ValidationState_t&)::
                              mutually_exclusive_per_id)[lVar55 * 2], bVar68)) {
                      var_instr = (Instruction *)CONCAT44(decoration_00,uVar27);
                      iVar43 = std::
                               _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                               ::find((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                                       *)&seen_vars,(key_type *)&var_instr);
                      if (iVar43._M_node == (_Base_ptr)&seen_vars._M_h._M_bucket_count) {
                        iVar25 = 0;
                      }
                      else {
                        pIVar37 = ValidationState_t::FindDef(vstate,uVar27);
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37
                                  );
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,"ID \'",4);
                        std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,"\' decorated with both ",0x16);
                        ValidationState_t::SpvDecorationString_abi_cxx11_
                                  ((string *)&output_var_builtin,vstate,uVar30);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                                   output_var_builtin._M_h._M_bucket_count);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8," and ",5);
                        ValidationState_t::SpvDecorationString_abi_cxx11_
                                  (&linkage_name,vstate,decoration_00);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8,linkage_name._M_dataplus._M_p,
                                   linkage_name._M_string_length);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_3f8," is not allowed.",0x10);
                        sVar29 = local_228;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)linkage_name._M_dataplus._M_p != &linkage_name.field_2) {
                          operator_delete(linkage_name._M_dataplus._M_p,
                                          linkage_name.field_2._M_allocated_capacity + 1);
                        }
                        if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                            &output_var_builtin._M_h._M_before_begin) {
                          operator_delete(output_var_builtin._M_h._M_buckets,
                                          (ulong)((long)&(output_var_builtin._M_h._M_before_begin.
                                                         _M_nxt)->_M_nxt + 1));
                        }
                        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                        iVar25 = 1;
                      }
                    }
                    if ((iVar25 != 6) && (iVar25 != 0)) goto LAB_002d61f3;
                    lVar55 = lVar55 + 1;
                  } while (lVar55 == 1);
                  iVar25 = 4;
LAB_002d61f3:
                  if (iVar25 == 4) {
                    iVar25 = 0;
                  }
                }
                goto LAB_002d65e5;
              }
LAB_002d65e9:
              iVar25 = 0;
            }
            if (iVar25 != 0) goto LAB_002d6606;
            pIVar63 = pIVar63 + 1;
          } while (pIVar63 != pIVar13);
          iVar25 = 2;
LAB_002d6606:
          if (iVar25 == 2) {
            sVar29 = SPV_SUCCESS;
          }
        }
        std::
        _Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
        ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int,_unsigned_int>_>_>
                    *)&input_var_builtin,(_Link_type)input_var_builtin._M_h._M_before_begin._M_nxt);
        std::
        _Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
        ::_M_erase((_Rb_tree<std::tuple<spv::Decoration,_unsigned_int>,_std::tuple<spv::Decoration,_unsigned_int>,_std::_Identity<std::tuple<spv::Decoration,_unsigned_int>_>,_std::less<std::tuple<spv::Decoration,_unsigned_int>_>,_std::allocator<std::tuple<spv::Decoration,_unsigned_int>_>_>
                    *)&seen_vars,(_Link_type)seen_vars._M_h._M_before_begin._M_nxt);
        local_61c = sVar29;
        if (sVar29 == SPV_SUCCESS) {
          pvVar45 = ValidationState_t::functions(vstate);
          this_00 = (pvVar45->
                    super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pFVar14 = (pvVar45->
                    super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
          local_61c = SPV_SUCCESS;
          if (this_00 != pFVar14) {
            do {
              sVar46 = Function::block_count(this_00);
              bVar19 = anon_unknown_0::hasImportLinkageAttribute(this_00->id_,vstate);
              bVar68 = true;
              if (sVar46 == 0) {
                if (!bVar19) {
                  pIVar37 = ValidationState_t::FindDef(vstate,this_00->id_);
                  ValidationState_t::diag
                            ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar37);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_3f8,"Function declaration (id ",0x19);
                  std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                  lVar55 = 0x48;
                  pcVar61 = 
                  ") must have a LinkageAttributes decoration with the Import Linkage type.";
                  goto LAB_002d6733;
                }
              }
              else if (bVar19) {
                pIVar37 = ValidationState_t::FindDef(vstate,this_00->id_);
                ValidationState_t::diag
                          ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_BINARY,pIVar37);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,"Function definition (id ",0x18);
                std::ostream::_M_insert<unsigned_long>((ulong)local_3f8);
                lVar55 = 0x30;
                pcVar61 = ") may not be decorated with Import Linkage type.";
LAB_002d6733:
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,pcVar61,lVar55);
                sVar29 = local_228;
                DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                bVar68 = false;
              }
              local_61c = sVar29;
            } while ((bVar68) &&
                    (this_00 = this_00 + 1, local_61c = SPV_SUCCESS, this_00 != pFVar14));
          }
          if (local_61c == SPV_SUCCESS) {
            MVar32 = ValidationState_t::memory_model(vstate);
            local_61c = SPV_SUCCESS;
            if (MVar32 == Vulkan) {
              input_var_builtin._M_h._M_buckets = &input_var_builtin._M_h._M_before_begin._M_nxt;
              input_var_builtin._M_h._M_bucket_count = 0;
              input_var_builtin._M_h._M_before_begin._M_nxt =
                   input_var_builtin._M_h._M_before_begin._M_nxt & 0xffffffffffffff00;
              std::__cxx11::ostringstream::ostringstream
                        ((ostringstream *)&seen_vars,(string *)&input_var_builtin,_S_out);
              p_Var47 = &(vstate->all_definitions_)._M_h._M_before_begin;
              do {
                p_Var47 = p_Var47->_M_nxt;
                if (p_Var47 == (__node_base *)0x0) {
                  local_61c = SPV_SUCCESS;
                  break;
                }
                pIVar37 = *(Instruction **)
                           &((_Prime_rehash_policy *)(p_Var47 + 2))->_M_max_load_factor;
                MVar28 = (pIVar37->inst_).result_id;
                local_3f8._0_4_ = MVar28;
                pmVar36 = std::
                          map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                          ::operator[](&vstate->id_decorations_,(key_type_conflict *)local_3f8);
                for (p_Var49 = (pmVar36->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
                    bVar68 = (_Rb_tree_header *)p_Var49 ==
                             &(pmVar36->_M_t)._M_impl.super__Rb_tree_header, !bVar68;
                    p_Var49 = (_Base_ptr)std::_Rb_tree_increment(p_Var49)) {
                  if ((p_Var49[1]._M_color | 2) == 0x17) {
                    pcVar61 = "Coherent";
                    if (p_Var49[1]._M_color != 0x17) {
                      pcVar61 = "Volatile";
                    }
                    _Var8 = p_Var49[2]._M_color;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars,pcVar61,8);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars," decoration targeting ",0x16);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_3f8,vstate,MVar28);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars,(char *)local_3f8,
                               (long)local_3f0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                    if (local_3f8 !=
                        (undefined1  [8])
                        &local_3f0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish) {
                      operator_delete((void *)local_3f8,
                                      (long)local_3f0.
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            ._M_impl.super__Vector_impl_data._M_finish + 1);
                    }
                    if (_Var8 != ~_S_red) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&seen_vars," (member index ",0xf);
                      poVar48 = (ostream *)
                                std::ostream::operator<<((ostringstream *)&seen_vars,_Var8);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar48,")",1);
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&seen_vars,
                               " is banned when using the Vulkan memory model.",0x2e);
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_3f8,vstate,SPV_ERROR_INVALID_ID,pIVar37);
                    std::__cxx11::stringbuf::str();
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3f8,(char *)output_var_builtin._M_h._M_buckets,
                               output_var_builtin._M_h._M_bucket_count);
                    local_61c = local_228;
                    if ((__node_base *)output_var_builtin._M_h._M_buckets !=
                        &output_var_builtin._M_h._M_before_begin) {
                      operator_delete(output_var_builtin._M_h._M_buckets,
                                      (ulong)((long)&(output_var_builtin._M_h._M_before_begin._M_nxt
                                                     )->_M_nxt + 1));
                    }
                    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_3f8);
                    bVar19 = false;
                  }
                  else {
                    bVar19 = true;
                  }
                  if (!bVar19) break;
                }
              } while (bVar68);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&seen_vars);
              std::ios_base::~ios_base(local_138);
              if ((__node_base *)input_var_builtin._M_h._M_buckets !=
                  &input_var_builtin._M_h._M_before_begin) {
                operator_delete(input_var_builtin._M_h._M_buckets,
                                (ulong)((long)&(input_var_builtin._M_h._M_before_begin._M_nxt)->
                                               _M_nxt + 1));
              }
            }
            if (local_61c == SPV_SUCCESS) {
              local_61c = anon_unknown_0::CheckDecorationsFromDecoration(vstate);
            }
          }
        }
      }
    }
  }
  return local_61c;
}

Assistant:

spv_result_t ValidateDecorations(ValidationState_t& vstate) {
  if (auto error = CheckImportedVariableInitialization(vstate)) return error;
  if (auto error = CheckDecorationsOfEntryPoints(vstate)) return error;
  if (auto error = CheckDecorationsOfBuffers(vstate)) return error;
  if (auto error = CheckDecorationsCompatibility(vstate)) return error;
  if (auto error = CheckLinkageAttrOfFunctions(vstate)) return error;
  if (auto error = CheckVulkanMemoryModelDeprecatedDecorations(vstate))
    return error;
  if (auto error = CheckDecorationsFromDecoration(vstate)) return error;
  return SPV_SUCCESS;
}